

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

bool nite::keyboardReleased(uint key)

{
  bool local_9;
  uint key_local;
  
  if (key < 0x65) {
    if ((isKeysStateReleased[key] & 1U) == 0) {
      if ((KeysState[key] & 1U) == 0) {
        if (((KeysState[key] & 1U) == 0) && ((KeysStateReleased[key] & 1U) != 0)) {
          KeysStateReleased[key] = false;
          isKeysStateReleased[key] = true;
          local_9 = true;
        }
        else {
          local_9 = false;
        }
      }
      else {
        KeysStateReleased[key] = true;
        local_9 = false;
      }
    }
    else {
      local_9 = true;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool nite::keyboardReleased(unsigned key){
	if (key >= niteKeysn){
		return 0;
	}

	if (isKeysStateReleased[key]){
		return 1;
	}

	if (KeysState[key]){
		KeysStateReleased[key] = 1;
		return 0;
	}

	if (!KeysState[key] and KeysStateReleased[key]){
		KeysStateReleased[key] = 0;
		isKeysStateReleased[key] = 1;
		return 1;
	}

	return 0;
}